

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_ar.c
# Opt level: O0

int archive_read_format_ar_skip(archive_read *a)

{
  long *plVar1;
  int64_t iVar2;
  ar *ar;
  int64_t bytes_skipped;
  archive_read *a_local;
  
  plVar1 = (long *)a->format->data;
  iVar2 = __archive_read_consume(a,*plVar1 + plVar1[3] + plVar1[1]);
  if (iVar2 < 0) {
    a_local._4_4_ = -0x1e;
  }
  else {
    *plVar1 = 0;
    plVar1[1] = 0;
    plVar1[3] = 0;
    a_local._4_4_ = 0;
  }
  return a_local._4_4_;
}

Assistant:

static int
archive_read_format_ar_skip(struct archive_read *a)
{
	int64_t bytes_skipped;
	struct ar* ar;

	ar = (struct ar *)(a->format->data);

	bytes_skipped = __archive_read_consume(a,
	    ar->entry_bytes_remaining + ar->entry_padding
	    + ar->entry_bytes_unconsumed);
	if (bytes_skipped < 0)
		return (ARCHIVE_FATAL);

	ar->entry_bytes_remaining = 0;
	ar->entry_bytes_unconsumed = 0;
	ar->entry_padding = 0;

	return (ARCHIVE_OK);
}